

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O3

void ncnn::qsort_descent_inplace<ncnn::Rect>
               (vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *datas,
               vector<float,_std::allocator<float>_> *scores,int left,int right)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float fVar3;
  float fVar4;
  pointer pRVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  pointer pfVar12;
  int right_00;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  
  pfVar12 = (scores->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_start;
  do {
    right_00 = right;
    iVar13 = left;
    if (left <= right) {
      fVar3 = pfVar12[(left + right) / 2];
      do {
        lVar15 = (long)iVar13 + -1;
        lVar17 = (long)iVar13 << 4;
        iVar11 = iVar13;
        do {
          iVar13 = iVar11;
          lVar14 = lVar17;
          lVar10 = lVar15 + 1;
          lVar15 = lVar15 + 1;
          lVar17 = lVar14 + 0x10;
          iVar11 = iVar13 + 1;
        } while (fVar3 < pfVar12[lVar10]);
        lVar17 = (long)right_00 + 1;
        lVar10 = (long)right_00 << 4;
        iVar11 = right_00;
        do {
          right_00 = iVar11;
          lVar16 = lVar10;
          lVar9 = lVar17 + -1;
          lVar17 = lVar17 + -1;
          lVar10 = lVar16 + -0x10;
          iVar11 = right_00 + -1;
        } while (pfVar12[lVar9] <= fVar3 && fVar3 != pfVar12[lVar9]);
        if (lVar15 <= lVar17) {
          pRVar5 = (datas->super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          puVar1 = (undefined8 *)((long)&pRVar5->x1 + lVar14);
          uVar6 = *puVar1;
          uVar7 = puVar1[1];
          puVar1 = (undefined8 *)((long)&pRVar5->x1 + lVar16);
          uVar8 = puVar1[1];
          puVar2 = (undefined8 *)((long)&pRVar5->x1 + lVar14);
          *puVar2 = *puVar1;
          puVar2[1] = uVar8;
          puVar1 = (undefined8 *)((long)&pRVar5->x1 + lVar16);
          *puVar1 = uVar6;
          puVar1[1] = uVar7;
          pfVar12 = (scores->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          fVar4 = pfVar12[lVar15];
          pfVar12[lVar15] = pfVar12[lVar17];
          pfVar12[lVar17] = fVar4;
          right_00 = right_00 + -1;
          iVar13 = iVar13 + 1;
        }
      } while (iVar13 <= right_00);
    }
    if (left < right_00) {
      qsort_descent_inplace<ncnn::Rect>(datas,scores,left,right_00);
      pfVar12 = (scores->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    left = iVar13;
  } while (iVar13 < right);
  return;
}

Assistant:

static void qsort_descent_inplace(std::vector<T>& datas, std::vector<float>& scores, int left, int right)
{
    int i = left;
    int j = right;
    float p = scores[(left + right) / 2];

    while (i <= j)
    {
        while (scores[i] > p)
            i++;

        while (scores[j] < p)
            j--;

        if (i <= j)
        {
            // swap
            std::swap(datas[i], datas[j]);
            std::swap(scores[i], scores[j]);

            i++;
            j--;
        }
    }

    if (left < j)
        qsort_descent_inplace(datas, scores, left, j);

    if (i < right)
        qsort_descent_inplace(datas, scores, i, right);
}